

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-death-test.cc
# Opt level: O2

void __thiscall testing::internal::DeathTestImpl::ReadAndInterpretStatusByte(DeathTestImpl *this)

{
  int iVar1;
  uint uVar2;
  ssize_t sVar3;
  int *piVar4;
  ostream *poVar5;
  int iVar6;
  char flag;
  allocator<char> local_211;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  Message error;
  int local_1ac;
  string local_1a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  char buffer [256];
  
  do {
    sVar3 = read(this->read_fd_,&flag,1);
    iVar1 = (int)sVar3;
    if (iVar1 != -1) {
      if (iVar1 == 0) {
        this->outcome_ = DIED;
        goto LAB_00119fa2;
      }
      if (iVar1 == 1) {
        if (flag == 'I') {
          iVar1 = this->read_fd_;
          Message::Message(&error);
          goto LAB_0011a0cc;
        }
        if (flag == 'L') {
          this->outcome_ = LIVED;
        }
        else if (flag == 'T') {
          this->outcome_ = THREW;
        }
        else if (flag == 'R') {
          this->outcome_ = RETURNED;
        }
        else {
          GTestLog::GTestLog((GTestLog *)buffer,GTEST_FATAL,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/aicpp[P]ailib/build_O2/test/googletest/googletest-src/googletest/src/gtest-death-test.cc"
                             ,0x1d1);
          poVar5 = std::operator<<((ostream *)&std::cerr,"Death test child process reported ");
          poVar5 = std::operator<<(poVar5,"unexpected status byte (");
          poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
          std::operator<<(poVar5,")");
          GTestLog::~GTestLog((GTestLog *)buffer);
        }
        goto LAB_00119fa2;
      }
      break;
    }
    piVar4 = __errno_location();
  } while (*piVar4 == 4);
  GTestLog::GTestLog((GTestLog *)&local_210,GTEST_FATAL,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/aicpp[P]ailib/build_O2/test/googletest/googletest-src/googletest/src/gtest-death-test.cc"
                     ,0x1d6);
  poVar5 = std::operator<<((ostream *)&std::cerr,"Read from death test child process failed: ");
  GetLastErrnoDescription_abi_cxx11_();
  std::operator<<(poVar5,(string *)buffer);
  std::__cxx11::string::~string((string *)buffer);
  GTestLog::~GTestLog((GTestLog *)&local_210);
  goto LAB_00119fa2;
  while( true ) {
    piVar4 = __errno_location();
    iVar6 = *piVar4;
    if (iVar6 != 4) break;
LAB_0011a0cc:
    while( true ) {
      sVar3 = read(iVar1,buffer,0xff);
      uVar2 = (uint)sVar3;
      if ((int)uVar2 < 1) break;
      buffer[uVar2 & 0x7fffffff] = '\0';
      std::operator<<((ostream *)((long)error.ss_.ptr_ + 0x10),buffer);
    }
    if (uVar2 != 0xffffffff) {
      if (uVar2 == 0) {
        GTestLog::GTestLog((GTestLog *)&local_1f0,GTEST_FATAL,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/aicpp[P]ailib/build_O2/test/googletest/googletest-src/googletest/src/gtest-death-test.cc"
                           ,0x150);
        StringStreamToString(&local_210,(stringstream *)error.ss_.ptr_);
        std::operator<<((ostream *)&std::cerr,(string *)&local_210);
        goto LAB_0011a237;
      }
      piVar4 = __errno_location();
      iVar6 = *piVar4;
      break;
    }
  }
  GTestLog::GTestLog((GTestLog *)&local_1f0,GTEST_FATAL,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/aicpp[P]ailib/build_O2/test/googletest/googletest-src/googletest/src/gtest-death-test.cc"
                     ,0x153);
  poVar5 = std::operator<<((ostream *)&std::cerr,"Error while reading death test internal: ");
  GetLastErrnoDescription_abi_cxx11_();
  poVar5 = std::operator<<(poVar5,(string *)&local_210);
  poVar5 = std::operator<<(poVar5," [");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar6);
  std::operator<<(poVar5,"]");
LAB_0011a237:
  std::__cxx11::string::~string((string *)&local_210);
  GTestLog::~GTestLog((GTestLog *)&local_1f0);
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr(&error.ss_);
LAB_00119fa2:
  do {
    iVar1 = close(this->read_fd_);
    if (iVar1 != -1) goto LAB_0011a08c;
    piVar4 = __errno_location();
  } while (*piVar4 == 4);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_188,"CHECK failed: File ",&local_211);
  std::operator+(&local_168,&local_188,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/aicpp[P]ailib/build_O2/test/googletest/googletest-src/googletest/src/gtest-death-test.cc"
                );
  std::operator+(&local_148,&local_168,", line ");
  local_1ac = 0x1d9;
  StreamableToString<int>(&local_1a8,&local_1ac);
  std::operator+(&local_1f0,&local_148,&local_1a8);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&error,
                 &local_1f0,": ");
  std::operator+(&local_210,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&error,
                 "posix::Close(read_fd())");
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)buffer,
                 &local_210," != -1");
  DeathTestAbort((string *)buffer);
LAB_0011a08c:
  this->read_fd_ = -1;
  return;
}

Assistant:

void DeathTestImpl::ReadAndInterpretStatusByte() {
  char flag;
  int bytes_read;

  // The read() here blocks until data is available (signifying the
  // failure of the death test) or until the pipe is closed (signifying
  // its success), so it's okay to call this in the parent before
  // the child process has exited.
  do {
    bytes_read = posix::Read(read_fd(), &flag, 1);
  } while (bytes_read == -1 && errno == EINTR);

  if (bytes_read == 0) {
    set_outcome(DIED);
  } else if (bytes_read == 1) {
    switch (flag) {
      case kDeathTestReturned:
        set_outcome(RETURNED);
        break;
      case kDeathTestThrew:
        set_outcome(THREW);
        break;
      case kDeathTestLived:
        set_outcome(LIVED);
        break;
      case kDeathTestInternalError:
        FailFromInternalError(read_fd());  // Does not return.
        break;
      default:
        GTEST_LOG_(FATAL) << "Death test child process reported "
                          << "unexpected status byte ("
                          << static_cast<unsigned int>(flag) << ")";
    }
  } else {
    GTEST_LOG_(FATAL) << "Read from death test child process failed: "
                      << GetLastErrnoDescription();
  }
  GTEST_DEATH_TEST_CHECK_SYSCALL_(posix::Close(read_fd()));
  set_read_fd(-1);
}